

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupWindow::adjustFlags(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  QWidget *this_00;
  QWindow *pQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *titleBarOf;
  int bottomFrame;
  bool lostNativeDecos;
  bool gainedNativeDecos;
  QDockWidget *top;
  QRect r;
  QRect newGeometry;
  WindowFlags flags;
  WindowFlags oldFlags;
  QWidget *in_stack_fffffffffffffed8;
  QWidget *in_stack_fffffffffffffee0;
  enum_type f1;
  QIcon *this_01;
  QSize *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  QDockWidgetGroupWindow *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined1 uVar5;
  byte bVar6;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff18;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  WId in_stack_ffffffffffffff38;
  QWidget *in_stack_ffffffffffffff40;
  long local_b0;
  long local_80;
  QFlagsStorageHelper<Qt::WindowType,_4> local_48;
  QFlagsStorageHelper<Qt::WindowType,_4> local_44;
  QFlagsStorageHelper<Qt::WindowType,_4> local_40;
  QFlagsStorageHelper<Qt::WindowType,_4> local_3c;
  Int local_38;
  Int local_34;
  Int local_30;
  QFlagsStorageHelper<Qt::WindowType,_4> local_2c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_28;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_24;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_20;
  QFlagsStorageHelper<Qt::WindowType,_4> local_1c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_18;
  QFlagsStorageHelper<Qt::WindowType,_4> local_14;
  QFlagsStorage<Qt::WindowType> local_10;
  QFlagsStorage<Qt::WindowType> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  local_10.i = (Int)QWidget::windowFlags(in_stack_fffffffffffffee0);
  local_c.i = local_10.i;
  this_00 = &activeTabbedDockWidget
                       ((QDockWidgetGroupWindow *)
                        CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18.i))->
             super_QWidget;
  if (this_00 == (QWidget *)0x0) {
    local_1c.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                    (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_18.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator|
                   ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                    (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_14.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator|
                   ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                    (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_10.i = (Int)local_14.super_QFlagsStorage<Qt::WindowType>.i;
  }
  else {
    QWidget::layout((QWidget *)0x5f096e);
    bVar1 = QDockWidgetGroupLayout::nativeWindowDeco((QDockWidgetGroupLayout *)0x5f0976);
    f1 = (enum_type)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    if (bVar1) {
      in_stack_ffffffffffffff1c.i = (Int)Qt::operator|(f1,(enum_type)in_stack_fffffffffffffee0);
      QFlags<Qt::WindowType>::operator|=
                ((QFlags<Qt::WindowType> *)&local_10,
                 (QFlags<Qt::WindowType>)in_stack_ffffffffffffff1c.i);
      local_24.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
           (QFlagsStorage<QDockWidget::DockWidgetFeature>)
           QDockWidget::features((QDockWidget *)in_stack_fffffffffffffee0);
      local_20.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
           (QFlagsStorage<QDockWidget::DockWidgetFeature>)
           QFlags<QDockWidget::DockWidgetFeature>::operator&
                     ((QFlags<QDockWidget::DockWidgetFeature> *)in_stack_fffffffffffffee0,
                      (DockWidgetFeature)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
      QFlags<Qt::WindowType>::setFlag
                ((QFlags<Qt::WindowType> *)in_RDI,
                 CONCAT13(in_stack_fffffffffffffeff,
                          CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)),
                 SUB41((uint)in_stack_fffffffffffffef8 >> 0x18,0));
      QFlags<Qt::WindowType>::operator&=((QFlags<Qt::WindowType> *)&local_10,0xfffff7ff);
    }
    else {
      local_2c.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)Qt::operator|(f1,(enum_type)in_stack_fffffffffffffee0);
      local_28.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator|
                     ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                      (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      in_stack_ffffffffffffff18.i =
           (Int)QFlags<Qt::WindowType>::operator~
                          ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0);
      QFlags<Qt::WindowType>::operator&=
                ((QFlags<Qt::WindowType> *)&local_10,
                 (QFlags<Qt::WindowType>)in_stack_ffffffffffffff18.i);
      QFlags<Qt::WindowType>::operator|=((QFlags<Qt::WindowType> *)&local_10,FramelessWindowHint);
    }
  }
  local_30 = local_c.i;
  local_34 = local_10.i;
  bVar1 = ::operator!=((QFlags<Qt::WindowType>)local_c.i,(QFlags<Qt::WindowType>)local_10.i);
  if (bVar1) {
    pQVar4 = QWidget::windowHandle(in_stack_fffffffffffffee0);
    if (pQVar4 == (QWindow *)0x0) {
      QWidget::create(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      (bool)in_stack_ffffffffffffff37,(bool)in_stack_ffffffffffffff36);
    }
    local_38 = local_10.i;
    QWidget::setWindowFlags
              (in_stack_fffffffffffffee0,
               (QFlagsStorageHelper<Qt::WindowType,_4>)
               SUB84((ulong)in_stack_fffffffffffffee8 >> 0x20,0));
    local_3c.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                    (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
    in_stack_fffffffffffffeff = false;
    if (IVar2 != 0) {
      local_40.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                      (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      in_stack_fffffffffffffeff =
           QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_40);
    }
    bVar6 = in_stack_fffffffffffffeff;
    local_44.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                    (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    bVar1 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_44);
    in_stack_fffffffffffffefe = false;
    if (bVar1) {
      local_48.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffee0,
                      (WindowType)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_48);
      in_stack_fffffffffffffefe = IVar2 != 0;
    }
    if ((bool)in_stack_fffffffffffffefe == false) {
      if (((bVar6 & 1) != 0) &&
         (uVar5 = in_stack_fffffffffffffefe,
         bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0)), bVar1)) {
        QWidget::geometry(in_RDI);
        iVar3 = QSize::width((QSize *)0x5f0d7f);
        in_stack_fffffffffffffef0 = -iVar3 / 2;
        iVar3 = QSize::width((QSize *)0x5f0d9f);
        in_stack_fffffffffffffef4 = -iVar3 / 2;
        QSize::height((QSize *)0x5f0dbf);
        QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8
                      ,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      (int)in_stack_fffffffffffffee0);
        QWidget::setGeometry
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18.i),
                   (QRect *)CONCAT17(bVar6,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff14,
                                                                   in_stack_ffffffffffffff10))));
        QSize::QSize((QSize *)in_stack_fffffffffffffee0);
        *(long *)(in_RDI + 2) = local_b0;
      }
    }
    else {
      uVar5 = in_stack_fffffffffffffefe;
      QWidget::geometry(in_RDI);
      QWidget::frameGeometry
                ((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18.i));
      QRect::top((QRect *)0x5f0c34);
      QRect::setTop((QRect *)in_stack_fffffffffffffee0,
                    (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      QWidget::geometry(in_RDI);
      in_stack_fffffffffffffef8 = QRect::top((QRect *)0x5f0c55);
      QWidget::frameGeometry
                ((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18.i));
      iVar3 = QRect::top((QRect *)0x5f0c80);
      iVar3 = in_stack_fffffffffffffef8 - iVar3;
      QWidget::frameSize(in_RDI);
      QWidget::size(in_stack_fffffffffffffed8);
      ::operator-((QSize *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  in_stack_fffffffffffffee8);
      QSize::width((QSize *)0x5f0cda);
      QSize::QSize((QSize *)in_stack_fffffffffffffee0,
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8);
      *(long *)(in_RDI + 2) = local_80;
      QWidget::setGeometry
                ((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18.i),
                 (QRect *)CONCAT17(bVar6,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff14,iVar3))))
      ;
    }
    bVar1 = hasVisibleDockWidgets(in_stack_ffffffffffffff08);
    (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,bVar1);
  }
  if (this_00 == (QWidget *)0x0) {
    this_00 = QWidget::parentWidget((QWidget *)0x5f0e46);
  }
  QWidget::windowTitle(this_00);
  QWidget::setWindowTitle
            (in_RDI,(QString *)
                    CONCAT17(in_stack_fffffffffffffeff,
                             CONCAT16(in_stack_fffffffffffffefe,
                                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
                            ));
  QString::~QString((QString *)0x5f0e7f);
  this_01 = (QIcon *)&stack0xffffffffffffff30;
  QWidget::windowIcon((QWidget *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,
                                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ))));
  QWidget::setWindowIcon
            ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (QIcon *)this_00);
  QIcon::~QIcon(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidgetGroupWindow::adjustFlags()
{
    Qt::WindowFlags oldFlags = windowFlags();
    Qt::WindowFlags flags = oldFlags;

#if QT_CONFIG(tabbar)
    QDockWidget *top = activeTabbedDockWidget();
#else
    QDockWidget *top = nullptr;
#endif
    if (!top) { // nested tabs, show window decoration
        flags =
            ((oldFlags & ~Qt::FramelessWindowHint) | Qt::CustomizeWindowHint | Qt::WindowTitleHint);
    } else if (static_cast<QDockWidgetGroupLayout *>(layout())->nativeWindowDeco()) {
        flags |= Qt::CustomizeWindowHint | Qt::WindowTitleHint;
        flags.setFlag(Qt::WindowCloseButtonHint, top->features() & QDockWidget::DockWidgetClosable);
        flags &= ~Qt::FramelessWindowHint;
    } else {
        flags &= ~(Qt::WindowCloseButtonHint | Qt::CustomizeWindowHint | Qt::WindowTitleHint);
        flags |= Qt::FramelessWindowHint;
    }

    if (oldFlags != flags) {
        if (!windowHandle())
            create(); // The desired geometry is forgotten if we call setWindowFlags before having a window
        setWindowFlags(flags);
        const bool gainedNativeDecos = (oldFlags & Qt::FramelessWindowHint) && !(flags & Qt::FramelessWindowHint);
        const bool lostNativeDecos = !(oldFlags & Qt::FramelessWindowHint) && (flags & Qt::FramelessWindowHint);

        // Adjust the geometry after gaining/losing decos, so that the client area appears always
        // at the same place when tabbing
        if (lostNativeDecos) {
            QRect newGeometry = geometry();
            newGeometry.setTop(frameGeometry().top());
            const int bottomFrame = geometry().top() - frameGeometry().top();
            m_removedFrameSize = QSize((frameSize() - size()).width(), bottomFrame);
            setGeometry(newGeometry);
        } else if (gainedNativeDecos && m_removedFrameSize.isValid()) {
            QRect r = geometry();
            r.adjust(-m_removedFrameSize.width() / 2, 0,
                     -m_removedFrameSize.width() / 2, -m_removedFrameSize.height());
            setGeometry(r);
            m_removedFrameSize = QSize();
        }

        setVisible(hasVisibleDockWidgets());
    }

    QWidget *titleBarOf = top ? top : parentWidget();
    setWindowTitle(titleBarOf->windowTitle());
    setWindowIcon(titleBarOf->windowIcon());
}